

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

IVec3 __thiscall tcu::calculatePackedPitch(tcu *this,TextureFormat *format,IVec3 *size)

{
  int x_;
  int iVar1;
  int iVar2;
  int extraout_EDX;
  IVec3 IVar3;
  int slicePitch;
  int rowPitch;
  int pixelSize;
  IVec3 *size_local;
  TextureFormat *format_local;
  
  x_ = TextureFormat::getPixelSize(format);
  iVar1 = Vector<int,_3>::x(size);
  iVar2 = Vector<int,_3>::y(size);
  Vector<int,_3>::Vector((Vector<int,_3> *)this,x_,x_ * iVar1,x_ * iVar1 * iVar2);
  IVar3.m_data[2] = extraout_EDX;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 calculatePackedPitch (const TextureFormat& format, const IVec3& size)
{
	const int pixelSize		= format.getPixelSize();
	const int rowPitch		= pixelSize * size.x();
	const int slicePitch	= rowPitch * size.y();

	return IVec3(pixelSize, rowPitch, slicePitch);
}